

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall google::protobuf::Message::CopyFrom(Message *this,Message *from)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar3;
  undefined4 extraout_var_01;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x17])();
  iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0x17])(from);
  if (CONCAT44(extraout_var_00,iVar2) != CONCAT44(extraout_var,iVar1)) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x50);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (from.GetDescriptor()) == (descriptor): ");
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,": Tried to copy from a message with a different type. to: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(CONCAT44(extraout_var,iVar1) + 8))
    ;
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", from: ");
    iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x17])(from);
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,*(string **)(CONCAT44(extraout_var_01,iVar1) + 8));
    internal::LogFinisher::operator=(&local_61,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::ReflectionOps::Copy(from,this);
  return;
}

Assistant:

void Message::CopyFrom(const Message& from) {
  const Descriptor* descriptor = GetDescriptor();
  GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
    << ": Tried to copy from a message with a different type. "
       "to: " << descriptor->full_name() << ", "
       "from: " << from.GetDescriptor()->full_name();
  ReflectionOps::Copy(from, this);
}